

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O1

string * __thiscall
EvalString::Evaluate_abi_cxx11_(string *__return_storage_ptr__,EvalString *this,Env *env)

{
  pointer ppVar1;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ppVar1 = (this->parsed_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar1 != (this->parsed_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (ppVar1->second == RAW) {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(ppVar1->first)._M_dataplus._M_p);
      }
      else {
        (*env->_vptr_Env[2])(local_50,env,ppVar1);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      ppVar1 = ppVar1 + 1;
    } while (ppVar1 != (this->parsed_).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

string EvalString::Evaluate(Env* env) const {
  string result;
  for (TokenList::const_iterator i = parsed_.begin(); i != parsed_.end(); ++i) {
    if (i->second == RAW)
      result.append(i->first);
    else
      result.append(env->LookupVariable(i->first));
  }
  return result;
}